

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O3

void __thiscall VulkanUtilities::VulkanMemoryPage::~VulkanMemoryPage(VulkanMemoryPage *this)

{
  string msg;
  string local_28;
  
  if (this->m_CPUMemory != (void *)0x0) {
    VulkanLogicalDevice::UnmapMemory
              (this->m_ParentMemoryMgr->m_LogicalDevice,(this->m_VkMemory).m_VkObject);
  }
  if ((this->m_AllocationMgr).m_FreeSize != (this->m_AllocationMgr).m_MaxSize) {
    Diligent::FormatString<char[52]>
              (&local_28,(char (*) [52])"Destroying a page with not all allocations released");
    Diligent::DebugAssertionFailed
              (local_28._M_dataplus._M_p,"~VulkanMemoryPage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0x60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  ~VulkanObjectWrapper(&this->m_VkMemory);
  Diligent::VariableSizeAllocationsManager::~VariableSizeAllocationsManager(&this->m_AllocationMgr);
  return;
}

Assistant:

VulkanMemoryPage::~VulkanMemoryPage()
{
    if (m_CPUMemory != nullptr)
    {
        // Unmapping memory is not necessary, byt anyway
        m_ParentMemoryMgr.m_LogicalDevice.UnmapMemory(m_VkMemory);
    }

    VERIFY(IsEmpty(), "Destroying a page with not all allocations released");
}